

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb-c.cpp
# Opt level: O2

duckdb_state
duckdb_open_internal
          (DBInstanceCacheWrapper *cache,char *path,duckdb_database *out,duckdb_config config,
          char **out_error)

{
  duckdb_database this;
  pointer database;
  DBConfig *pDVar1;
  undefined1 local_758 [24];
  char *path_local;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  string path_str;
  DBConfig default_config;
  
  path_local = path;
  this = (duckdb_database)operator_new(0x10);
  *(undefined8 *)this = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  duckdb::DBConfig::DBConfig(&default_config);
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffff8c8,"duckdb_api",(allocator *)local_758);
  duckdb::Value::Value((Value *)&path_str,"capi");
  duckdb::DBConfig::SetOptionByName
            (&default_config,(string *)&stack0xfffffffffffff8c8,(Value *)&path_str);
  duckdb::Value::~Value((Value *)&path_str);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff8c8);
  pDVar1 = &default_config;
  if (config != (duckdb_config)0x0) {
    pDVar1 = (DBConfig *)config;
  }
  local_758._16_8_ = pDVar1;
  if (cache == (DBInstanceCacheWrapper *)0x0) {
    duckdb::make_shared_ptr<duckdb::DuckDB,char_const*&,duckdb::DBConfig*&>
              ((char **)&path_str,(DBConfig **)&path_local);
    duckdb::shared_ptr<duckdb::DuckDB,_true>::operator=
              ((shared_ptr<duckdb::DuckDB,_true> *)this,
               (shared_ptr<duckdb::DuckDB,_true> *)&path_str);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&path_str._M_string_length);
  }
  else {
    path_str._M_dataplus._M_p = (pointer)&path_str.field_2;
    path_str._M_string_length = 0;
    path_str.field_2._M_local_buf[0] = '\0';
    if (path != (char *)0x0) {
      std::__cxx11::string::assign((char *)&path_str);
    }
    database = duckdb::
               unique_ptr<duckdb::DBInstanceCache,_std::default_delete<duckdb::DBInstanceCache>,_true>
               ::operator->(&cache->instance_cache);
    local_728 = 0;
    uStack_720 = 0;
    local_738 = (pointer)0x0;
    uStack_730 = 0;
    duckdb::DBInstanceCache::GetOrCreateInstance
              ((DBInstanceCache *)local_758,(string *)database,(DBConfig *)&path_str,SUB81(pDVar1,0)
               ,(function<void_(duckdb::DuckDB_&)> *)0x1);
    duckdb::shared_ptr<duckdb::DuckDB,_true>::operator=
              ((shared_ptr<duckdb::DuckDB,_true> *)this,
               (shared_ptr<duckdb::DuckDB,_true> *)local_758);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_758 + 8));
    std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff8c8);
    std::__cxx11::string::~string((string *)&path_str);
  }
  duckdb::DBConfig::~DBConfig(&default_config);
  *out = this;
  return DuckDBSuccess;
}

Assistant:

duckdb_state duckdb_open_internal(DBInstanceCacheWrapper *cache, const char *path, duckdb_database *out,
                                  duckdb_config config, char **out_error) {
	auto wrapper = new DatabaseWrapper();
	try {
		DBConfig default_config;
		default_config.SetOptionByName("duckdb_api", "capi");

		DBConfig *db_config = &default_config;
		DBConfig *user_config = reinterpret_cast<DBConfig *>(config);
		if (user_config) {
			db_config = user_config;
		}

		if (cache) {
			duckdb::string path_str;
			if (path) {
				path_str = path;
			}
			wrapper->database = cache->instance_cache->GetOrCreateInstance(path_str, *db_config, true);
		} else {
			wrapper->database = duckdb::make_shared_ptr<DuckDB>(path, db_config);
		}

	} catch (std::exception &ex) {
		if (out_error) {
			ErrorData parsed_error(ex);
			*out_error = strdup(parsed_error.Message().c_str());
		}
		delete wrapper;
		return DuckDBError;

	} catch (...) { // LCOV_EXCL_START
		if (out_error) {
			*out_error = strdup("Unknown error");
		}
		delete wrapper;
		return DuckDBError;
	} // LCOV_EXCL_STOP

	*out = reinterpret_cast<duckdb_database>(wrapper);
	return DuckDBSuccess;
}